

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testGroupStarting(XmlReporter *this,GroupInfo *groupInfo)

{
  GroupInfo *in_stack_ffffffffffffff68;
  allocator *paVar1;
  StreamingReporterBase *in_stack_ffffffffffffff70;
  allocator local_69;
  string local_68 [40];
  string *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  XmlWriter *in_stack_ffffffffffffffd0;
  
  StreamingReporterBase::testGroupStarting(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffd0,"Group",(allocator *)&stack0xffffffffffffffcf);
  XmlWriter::startElement((XmlWriter *)in_stack_ffffffffffffff70,&in_stack_ffffffffffffff68->name);
  paVar1 = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"name",paVar1);
  XmlWriter::writeAttribute
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  return;
}

Assistant:

virtual void testGroupStarting( GroupInfo const& groupInfo ) CATCH_OVERRIDE {
            StreamingReporterBase::testGroupStarting( groupInfo );
            m_xml.startElement( "Group" )
                .writeAttribute( "name", groupInfo.name );
        }